

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_JP2K.cpp
# Opt level: O2

lh__Writer * __thiscall
ASDCP::JP2K::lh__Writer::SetSourceStream
          (lh__Writer *this,PictureDescriptor *PDesc,string *label,Rational LocalEditRate)

{
  PictureDescriptor *PDesc_00;
  pointer pcVar1;
  GenericPictureEssenceDescriptor *EssenceDescriptor;
  JPEG2000PictureSubDescriptor *EssenceSubDescriptor;
  long lVar2;
  undefined8 uVar3;
  ui32_t BytesPerEditUnit;
  MDDEntry *pMVar4;
  undefined2 uVar5;
  Dictionary *extraout_RDX;
  pointer in_R8;
  int iVar6;
  undefined **local_108;
  int local_100;
  undefined4 local_fc;
  undefined1 local_f8 [17];
  undefined8 uStack_e7;
  UL local_d8;
  string local_b8;
  
  lVar2._0_4_ = PDesc->ContainerDuration;
  lVar2._4_4_ = (PDesc->SampleRate).Numerator;
  if (lVar2 == 0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_JP2K.cpp"
                  ,0x4bb,
                  "ASDCP::Result_t ASDCP::JP2K::lh__Writer::SetSourceStream(const PictureDescriptor &, const std::string &, ASDCP::Rational)"
                 );
  }
  if (*(int *)(PDesc[1].ExtendedCapabilities.Ccap + 10) == 1) {
    iVar6 = (int)in_R8;
    pcVar1 = (label->_M_dataplus)._M_p;
    if ((ulong)in_R8 >> 0x20 == 0 && iVar6 == 0) {
      in_R8 = pcVar1;
      iVar6 = (int)pcVar1;
    }
    PDesc_00 = (PictureDescriptor *)(PDesc[3].QuantizationDefault.SPqcd + 0xf2);
    memcpy(PDesc_00,label,0x1d8);
    EssenceDescriptor =
         *(GenericPictureEssenceDescriptor **)(PDesc[1].QuantizationDefault.SPqcd + 0xc2);
    if (EssenceDescriptor == (GenericPictureEssenceDescriptor *)0x0) {
      __assert_fail("m_EssenceDescriptor",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_JP2K.cpp"
                    ,0x4c4,
                    "ASDCP::Result_t ASDCP::JP2K::lh__Writer::SetSourceStream(const PictureDescriptor &, const std::string &, ASDCP::Rational)"
                   );
    }
    EssenceSubDescriptor =
         *(JPEG2000PictureSubDescriptor **)(PDesc[3].QuantizationDefault.SPqcd + 0xea);
    if (EssenceSubDescriptor == (JPEG2000PictureSubDescriptor *)0x0) {
      __assert_fail("m_EssenceSubDescriptor",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_JP2K.cpp"
                    ,0x4c5,
                    "ASDCP::Result_t ASDCP::JP2K::lh__Writer::SetSourceStream(const PictureDescriptor &, const std::string &, ASDCP::Rational)"
                   );
    }
    JP2K_PDesc_to_MD((ASDCP *)this,PDesc_00,extraout_RDX,EssenceDescriptor,EssenceSubDescriptor);
    if (-1 < *(int *)&(this->super_h__ASDCPWriter).super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.
                      _vptr_TrackFileWriter) {
      lVar2 = *(long *)(PDesc[1].QuantizationDefault.SPqcd + 0xc2);
      if (*(uint *)((long)&label->field_2 + 4) < 0x801) {
        pMVar4 = Dictionary::Type(*(Dictionary **)&PDesc->ContainerDuration,
                                  MDD_JP2KEssenceCompression_2K);
        uVar5 = 3;
      }
      else {
        pMVar4 = Dictionary::Type(*(Dictionary **)&PDesc->ContainerDuration,
                                  MDD_JP2KEssenceCompression_4K);
        uVar5 = 4;
      }
      *(undefined1 *)(lVar2 + 0x218) = 1;
      uVar3 = *(undefined8 *)(pMVar4->ul + 8);
      *(undefined8 *)(lVar2 + 0x219) = *(undefined8 *)pMVar4->ul;
      *(undefined8 *)(lVar2 + 0x221) = uVar3;
      *(undefined2 *)(*(long *)(PDesc[3].QuantizationDefault.SPqcd + 0xea) + 0xa0) = uVar5;
      pMVar4 = Dictionary::Type(*(Dictionary **)&PDesc->ContainerDuration,MDD_JPEG2000Essence);
      uVar3 = *(undefined8 *)(pMVar4->ul + 8);
      *(undefined8 *)(PDesc[4].QuantizationDefault.SPqcd + 0xf2) = *(undefined8 *)pMVar4->ul;
      *(undefined8 *)(PDesc[4].QuantizationDefault.SPqcd + 0xfa) = uVar3;
      *(undefined1 *)&PDesc[4].ExtendedCapabilities.Pcap = 1;
      MXF::h__WriterState::Goto_READY((h__WriterState *)&stack0xffffffffffffff68);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff68);
      Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
      if (-1 < *(int *)&(this->super_h__ASDCPWriter).super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.
                        _vptr_TrackFileWriter) {
        pMVar4 = Dictionary::Type(*(Dictionary **)&PDesc->ContainerDuration,
                                  MDD_MXFGCFUFrameWrappedPictureElement);
        local_b8._M_string_length._0_1_ = 1;
        local_b8._9_8_ = *(undefined8 *)pMVar4->ul;
        local_b8.field_2._1_8_ = *(undefined8 *)(pMVar4->ul + 8);
        local_b8._M_dataplus._M_p = (pointer)&PTR__IArchive_002112c8;
        local_d8.super_Identifier<16U>.m_HasValue = true;
        local_d8.super_Identifier<16U>.m_Value._0_8_ =
             *(undefined8 *)(PDesc[4].QuantizationDefault.SPqcd + 0xf2);
        local_d8.super_Identifier<16U>.m_Value._8_8_ =
             *(undefined8 *)(PDesc[4].QuantizationDefault.SPqcd + 0xfa);
        local_d8.super_Identifier<16U>.super_IArchive._vptr_IArchive =
             (_func_int **)&PTR__IArchive_002112c8;
        pMVar4 = Dictionary::Type(*(Dictionary **)&PDesc->ContainerDuration,MDD_PictureDataDef);
        local_f8[8] = 1;
        local_f8._9_8_ = *(undefined8 *)pMVar4->ul;
        uStack_e7 = *(undefined8 *)(pMVar4->ul + 8);
        local_f8._0_8_ = &PTR__IArchive_002112c8;
        local_108 = &PTR__IArchive_00216710;
        local_fc = (undefined4)((ulong)in_R8 >> 0x20);
        local_100 = iVar6;
        BytesPerEditUnit = derive_timecode_rate_from_edit_rate((Rational *)PDesc_00);
        h__ASDCPWriter::WriteASDCPHeader
                  ((h__ASDCPWriter *)&stack0xffffffffffffff68,(string *)PDesc,(UL *)LocalEditRate,
                   &local_b8,(UL *)&PICT_DEF_LABEL_abi_cxx11_,&local_d8,(Rational *)local_f8,
                   (ui32_t)&local_108,BytesPerEditUnit);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff68);
        Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
      }
    }
  }
  else {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
lh__Writer::SetSourceStream(const PictureDescriptor& PDesc, const std::string& label, ASDCP::Rational LocalEditRate)
{
  assert(m_Dict);
  if ( ! m_State.Test_INIT() )
    return RESULT_STATE;

  if ( LocalEditRate == ASDCP::Rational(0,0) )
    LocalEditRate = PDesc.EditRate;

  m_PDesc = PDesc;
  assert(m_Dict);
  assert(m_EssenceDescriptor);
  assert(m_EssenceSubDescriptor);
  Result_t result = JP2K_PDesc_to_MD(m_PDesc, *m_Dict,
				     *static_cast<ASDCP::MXF::GenericPictureEssenceDescriptor*>(m_EssenceDescriptor),
				     *m_EssenceSubDescriptor);

  if ( ASDCP_SUCCESS(result) )
    {
      if ( PDesc.StoredWidth < 2049 )
	{
	  static_cast<ASDCP::MXF::RGBAEssenceDescriptor*>(m_EssenceDescriptor)->PictureEssenceCoding.Set(m_Dict->ul(MDD_JP2KEssenceCompression_2K));
	  m_EssenceSubDescriptor->Rsize = 3;
	}
      else
	{
	  static_cast<ASDCP::MXF::RGBAEssenceDescriptor*>(m_EssenceDescriptor)->PictureEssenceCoding.Set(m_Dict->ul(MDD_JP2KEssenceCompression_4K));
	  m_EssenceSubDescriptor->Rsize = 4;
	}

      memcpy(m_EssenceUL, m_Dict->ul(MDD_JPEG2000Essence), SMPTE_UL_LENGTH);
      m_EssenceUL[SMPTE_UL_LENGTH-1] = 1; // first (and only) essence container
      result = m_State.Goto_READY();
    }

  if ( ASDCP_SUCCESS(result) )
    {
      result = WriteASDCPHeader(label, UL(m_Dict->ul(MDD_MXFGCFUFrameWrappedPictureElement)),
				PICT_DEF_LABEL, UL(m_EssenceUL), UL(m_Dict->ul(MDD_PictureDataDef)),
				LocalEditRate, derive_timecode_rate_from_edit_rate(m_PDesc.EditRate));
    }

  return result;
}